

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

void get_mon_num_prep(_func__Bool_monster_race_ptr *get_mon_num_hook)

{
  alloc_entry *paVar1;
  _Bool _Var2;
  int16_t iVar3;
  undefined4 uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = 0xc;
  lVar6 = 0;
  iVar3 = alloc_race_size;
  do {
    paVar1 = alloc_race_table;
    if (iVar3 <= lVar6) {
      return;
    }
    if (get_mon_num_hook == (_func__Bool_monster_race_ptr *)0x0) {
LAB_00174cd1:
      uVar4 = *(undefined4 *)((long)paVar1 + lVar5 + -4);
    }
    else {
      _Var2 = (*get_mon_num_hook)(r_info + *(int *)((long)alloc_race_table + lVar5 + -0xc));
      uVar4 = 0;
      iVar3 = alloc_race_size;
      if (_Var2) goto LAB_00174cd1;
    }
    *(undefined4 *)((long)&paVar1->index + lVar5) = uVar4;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x14;
  } while( true );
}

Assistant:

void get_mon_num_prep(bool (*get_mon_num_hook)(struct monster_race *race))
{
	int i;

	/* Scan the allocation table */
	for (i = 0; i < alloc_race_size; i++) {
		alloc_entry *entry = &alloc_race_table[i];

		/* Check the restriction, if any */
		if (!get_mon_num_hook || (*get_mon_num_hook)(&r_info[entry->index])) {
			/* Accept this monster */
			entry->prob2 = entry->prob1;

		} else {
			/* Do not use this monster */
			entry->prob2 = 0;
		}
	}
}